

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  _func_int **pp_Var20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong unaff_R14;
  size_t mask;
  undefined1 (*pauVar33) [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  int mask_1;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined4 local_2514;
  RayQueryContext *local_2510;
  ulong local_2508;
  ulong local_2500;
  ulong local_24f8;
  undefined1 (*local_24f0) [16];
  Scene *local_24e8;
  RTCIntersectFunctionNArguments local_24e0;
  Geometry *local_24b0;
  undefined8 local_24a8;
  RTCIntersectArguments *local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      aVar4 = (ray->super_RayK<1>).dir.field_0;
      auVar35 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx((undefined1  [16])aVar4,auVar39);
      auVar52._8_4_ = 0x219392ef;
      auVar52._0_8_ = 0x219392ef219392ef;
      auVar52._12_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar39,auVar52,1);
      auVar39 = vblendvps_avx((undefined1  [16])aVar4,auVar52,auVar39);
      auVar52 = vrcpps_avx(auVar39);
      fVar10 = auVar52._0_4_;
      auVar42._0_4_ = auVar39._0_4_ * fVar10;
      fVar11 = auVar52._4_4_;
      auVar42._4_4_ = auVar39._4_4_ * fVar11;
      fVar12 = auVar52._8_4_;
      auVar42._8_4_ = auVar39._8_4_ * fVar12;
      fVar13 = auVar52._12_4_;
      auVar42._12_4_ = auVar39._12_4_ * fVar13;
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = &DAT_3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar53,auVar42);
      uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar3;
      local_23c0._0_4_ = uVar3;
      local_23c0._8_4_ = uVar3;
      local_23c0._12_4_ = uVar3;
      local_23c0._16_4_ = uVar3;
      local_23c0._20_4_ = uVar3;
      local_23c0._24_4_ = uVar3;
      local_23c0._28_4_ = uVar3;
      auVar57 = ZEXT3264(local_23c0);
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar3;
      local_23e0._0_4_ = uVar3;
      local_23e0._8_4_ = uVar3;
      local_23e0._12_4_ = uVar3;
      local_23e0._16_4_ = uVar3;
      local_23e0._20_4_ = uVar3;
      local_23e0._24_4_ = uVar3;
      local_23e0._28_4_ = uVar3;
      auVar59 = ZEXT3264(local_23e0);
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar3;
      local_2400._0_4_ = uVar3;
      local_2400._8_4_ = uVar3;
      local_2400._12_4_ = uVar3;
      local_2400._16_4_ = uVar3;
      local_2400._20_4_ = uVar3;
      local_2400._24_4_ = uVar3;
      local_2400._28_4_ = uVar3;
      auVar61 = ZEXT3264(local_2400);
      auVar43._0_4_ = fVar10 + fVar10 * auVar39._0_4_;
      auVar43._4_4_ = fVar11 + fVar11 * auVar39._4_4_;
      auVar43._8_4_ = fVar12 + fVar12 * auVar39._8_4_;
      auVar43._12_4_ = fVar13 + fVar13 * auVar39._12_4_;
      local_24f0 = (undefined1 (*) [16])local_2390;
      auVar39 = vshufps_avx(auVar43,auVar43,0);
      local_2420._16_16_ = auVar39;
      local_2420._0_16_ = auVar39;
      auVar62 = ZEXT3264(local_2420);
      auVar39 = vmovshdup_avx(auVar43);
      auVar51 = ZEXT1664(auVar39);
      auVar52 = vshufps_avx(auVar43,auVar43,0x55);
      local_2440._16_16_ = auVar52;
      local_2440._0_16_ = auVar52;
      auVar63 = ZEXT3264(local_2440);
      auVar52 = vshufpd_avx(auVar43,auVar43,1);
      auVar55 = ZEXT1664(auVar52);
      auVar42 = vshufps_avx(auVar43,auVar43,0xaa);
      auVar47 = ZEXT1664(auVar42);
      local_2460._16_16_ = auVar42;
      local_2460._0_16_ = auVar42;
      auVar64 = ZEXT3264(local_2460);
      local_24f8 = (ulong)(auVar43._0_4_ < 0.0) << 5;
      local_2500 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x40;
      local_2508 = (ulong)(auVar52._0_4_ < 0.0) << 5 | 0x80;
      uVar23 = local_24f8 ^ 0x20;
      uVar27 = local_2500 ^ 0x20;
      uVar28 = local_2508 ^ 0x20;
      auVar39 = vshufps_avx(auVar35,auVar35,0);
      local_2480._16_16_ = auVar39;
      local_2480._0_16_ = auVar39;
      auVar65 = ZEXT3264(local_2480);
      auVar39 = vshufps_avx(auVar40,auVar40,0);
      auVar34 = ZEXT3264(CONCAT1616(auVar39,auVar39));
      uVar29 = local_24f8;
      uVar30 = local_2500;
      uVar31 = local_2508;
      local_2510 = context;
      do {
        fVar10 = (ray->super_RayK<1>).tfar;
        auVar38 = ZEXT464((uint)fVar10);
        do {
          if (local_24f0 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar33 = local_24f0 + -1;
          local_24f0 = local_24f0 + -1;
        } while (fVar10 < *(float *)(*pauVar33 + 8));
        uVar21 = *(ulong *)*local_24f0;
        do {
          auVar60 = auVar61._0_32_;
          auVar58 = auVar59._0_32_;
          auVar56 = auVar57._0_32_;
          if ((uVar21 & 8) == 0) {
            uVar19 = uVar21 & 0xfffffffffffffff0;
            fVar10 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar41._4_4_ = fVar10;
            auVar41._0_4_ = fVar10;
            auVar41._8_4_ = fVar10;
            auVar41._12_4_ = fVar10;
            auVar41._16_4_ = fVar10;
            auVar41._20_4_ = fVar10;
            auVar41._24_4_ = fVar10;
            auVar41._28_4_ = fVar10;
            pfVar2 = (float *)(uVar19 + 0x100 + uVar29);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar29);
            auVar37._0_4_ = fVar10 * *pfVar2 + *pfVar1;
            auVar37._4_4_ = fVar10 * pfVar2[1] + pfVar1[1];
            auVar37._8_4_ = fVar10 * pfVar2[2] + pfVar1[2];
            auVar37._12_4_ = fVar10 * pfVar2[3] + pfVar1[3];
            auVar37._16_4_ = fVar10 * pfVar2[4] + pfVar1[4];
            auVar37._20_4_ = fVar10 * pfVar2[5] + pfVar1[5];
            auVar37._24_4_ = fVar10 * pfVar2[6] + pfVar1[6];
            auVar37._28_4_ = auVar38._28_4_ + pfVar1[7];
            auVar37 = vsubps_avx(auVar37,auVar56);
            auVar14._4_4_ = auVar62._4_4_ * auVar37._4_4_;
            auVar14._0_4_ = auVar62._0_4_ * auVar37._0_4_;
            auVar14._8_4_ = auVar62._8_4_ * auVar37._8_4_;
            auVar14._12_4_ = auVar62._12_4_ * auVar37._12_4_;
            auVar14._16_4_ = auVar62._16_4_ * auVar37._16_4_;
            auVar14._20_4_ = auVar62._20_4_ * auVar37._20_4_;
            auVar14._24_4_ = auVar62._24_4_ * auVar37._24_4_;
            auVar14._28_4_ = auVar37._28_4_;
            pfVar2 = (float *)(uVar19 + 0x100 + uVar30);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar30);
            auVar45._0_4_ = fVar10 * *pfVar2 + *pfVar1;
            auVar45._4_4_ = fVar10 * pfVar2[1] + pfVar1[1];
            auVar45._8_4_ = fVar10 * pfVar2[2] + pfVar1[2];
            auVar45._12_4_ = fVar10 * pfVar2[3] + pfVar1[3];
            auVar45._16_4_ = fVar10 * pfVar2[4] + pfVar1[4];
            auVar45._20_4_ = fVar10 * pfVar2[5] + pfVar1[5];
            auVar45._24_4_ = fVar10 * pfVar2[6] + pfVar1[6];
            auVar45._28_4_ = auVar47._28_4_ + pfVar1[7];
            auVar37 = vmaxps_avx(auVar65._0_32_,auVar14);
            auVar14 = vsubps_avx(auVar45,auVar58);
            pfVar2 = (float *)(uVar19 + 0x100 + uVar31);
            auVar9._4_4_ = auVar63._4_4_ * auVar14._4_4_;
            auVar9._0_4_ = auVar63._0_4_ * auVar14._0_4_;
            auVar9._8_4_ = auVar63._8_4_ * auVar14._8_4_;
            auVar9._12_4_ = auVar63._12_4_ * auVar14._12_4_;
            auVar9._16_4_ = auVar63._16_4_ * auVar14._16_4_;
            auVar9._20_4_ = auVar63._20_4_ * auVar14._20_4_;
            auVar9._24_4_ = auVar63._24_4_ * auVar14._24_4_;
            auVar9._28_4_ = auVar14._28_4_;
            pfVar1 = (float *)(uVar19 + 0x40 + uVar31);
            auVar49._0_4_ = fVar10 * *pfVar2 + *pfVar1;
            auVar49._4_4_ = fVar10 * pfVar2[1] + pfVar1[1];
            auVar49._8_4_ = fVar10 * pfVar2[2] + pfVar1[2];
            auVar49._12_4_ = fVar10 * pfVar2[3] + pfVar1[3];
            auVar49._16_4_ = fVar10 * pfVar2[4] + pfVar1[4];
            auVar49._20_4_ = fVar10 * pfVar2[5] + pfVar1[5];
            auVar49._24_4_ = fVar10 * pfVar2[6] + pfVar1[6];
            auVar49._28_4_ = auVar51._28_4_ + pfVar1[7];
            auVar14 = vsubps_avx(auVar49,auVar60);
            auVar8._4_4_ = auVar64._4_4_ * auVar14._4_4_;
            auVar8._0_4_ = auVar64._0_4_ * auVar14._0_4_;
            auVar8._8_4_ = auVar64._8_4_ * auVar14._8_4_;
            auVar8._12_4_ = auVar64._12_4_ * auVar14._12_4_;
            auVar8._16_4_ = auVar64._16_4_ * auVar14._16_4_;
            auVar8._20_4_ = auVar64._20_4_ * auVar14._20_4_;
            fVar11 = auVar14._28_4_;
            auVar8._24_4_ = auVar64._24_4_ * auVar14._24_4_;
            auVar8._28_4_ = fVar11;
            auVar14 = vmaxps_avx(auVar9,auVar8);
            pfVar2 = (float *)(uVar19 + 0x100 + uVar23);
            auVar9 = vmaxps_avx(auVar37,auVar14);
            auVar38 = ZEXT3264(auVar9);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar23);
            auVar46._0_4_ = fVar10 * *pfVar2 + *pfVar1;
            auVar46._4_4_ = fVar10 * pfVar2[1] + pfVar1[1];
            auVar46._8_4_ = fVar10 * pfVar2[2] + pfVar1[2];
            auVar46._12_4_ = fVar10 * pfVar2[3] + pfVar1[3];
            auVar46._16_4_ = fVar10 * pfVar2[4] + pfVar1[4];
            auVar46._20_4_ = fVar10 * pfVar2[5] + pfVar1[5];
            auVar46._24_4_ = fVar10 * pfVar2[6] + pfVar1[6];
            auVar46._28_4_ = fVar11 + pfVar1[7];
            auVar37 = vsubps_avx(auVar46,auVar56);
            pfVar2 = (float *)(uVar19 + 0x100 + uVar27);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar27);
            auVar50._0_4_ = fVar10 * *pfVar2 + *pfVar1;
            auVar50._4_4_ = fVar10 * pfVar2[1] + pfVar1[1];
            auVar50._8_4_ = fVar10 * pfVar2[2] + pfVar1[2];
            auVar50._12_4_ = fVar10 * pfVar2[3] + pfVar1[3];
            auVar50._16_4_ = fVar10 * pfVar2[4] + pfVar1[4];
            auVar50._20_4_ = fVar10 * pfVar2[5] + pfVar1[5];
            auVar50._24_4_ = fVar10 * pfVar2[6] + pfVar1[6];
            auVar50._28_4_ = fVar11 + pfVar1[7];
            auVar15._4_4_ = auVar62._4_4_ * auVar37._4_4_;
            auVar15._0_4_ = auVar62._0_4_ * auVar37._0_4_;
            auVar15._8_4_ = auVar62._8_4_ * auVar37._8_4_;
            auVar15._12_4_ = auVar62._12_4_ * auVar37._12_4_;
            auVar15._16_4_ = auVar62._16_4_ * auVar37._16_4_;
            auVar15._20_4_ = auVar62._20_4_ * auVar37._20_4_;
            auVar15._24_4_ = auVar62._24_4_ * auVar37._24_4_;
            auVar15._28_4_ = auVar37._28_4_;
            auVar37 = vsubps_avx(auVar50,auVar58);
            pfVar2 = (float *)(uVar19 + 0x100 + uVar28);
            auVar16._4_4_ = auVar63._4_4_ * auVar37._4_4_;
            auVar16._0_4_ = auVar63._0_4_ * auVar37._0_4_;
            auVar16._8_4_ = auVar63._8_4_ * auVar37._8_4_;
            auVar16._12_4_ = auVar63._12_4_ * auVar37._12_4_;
            auVar16._16_4_ = auVar63._16_4_ * auVar37._16_4_;
            auVar16._20_4_ = auVar63._20_4_ * auVar37._20_4_;
            auVar16._24_4_ = auVar63._24_4_ * auVar37._24_4_;
            auVar16._28_4_ = auVar37._28_4_;
            pfVar1 = (float *)(uVar19 + 0x40 + uVar28);
            auVar54._0_4_ = fVar10 * *pfVar2 + *pfVar1;
            auVar54._4_4_ = fVar10 * pfVar2[1] + pfVar1[1];
            auVar54._8_4_ = fVar10 * pfVar2[2] + pfVar1[2];
            auVar54._12_4_ = fVar10 * pfVar2[3] + pfVar1[3];
            auVar54._16_4_ = fVar10 * pfVar2[4] + pfVar1[4];
            auVar54._20_4_ = fVar10 * pfVar2[5] + pfVar1[5];
            auVar54._24_4_ = fVar10 * pfVar2[6] + pfVar1[6];
            auVar54._28_4_ = auVar55._28_4_ + pfVar1[7];
            auVar37 = vsubps_avx(auVar54,auVar60);
            auVar17._4_4_ = auVar64._4_4_ * auVar37._4_4_;
            auVar17._0_4_ = auVar64._0_4_ * auVar37._0_4_;
            auVar17._8_4_ = auVar64._8_4_ * auVar37._8_4_;
            auVar17._12_4_ = auVar64._12_4_ * auVar37._12_4_;
            auVar17._16_4_ = auVar64._16_4_ * auVar37._16_4_;
            auVar17._20_4_ = auVar64._20_4_ * auVar37._20_4_;
            auVar17._24_4_ = auVar64._24_4_ * auVar37._24_4_;
            auVar17._28_4_ = auVar37._28_4_;
            auVar55 = ZEXT3264(auVar17);
            auVar14 = vminps_avx(auVar16,auVar17);
            auVar37 = vminps_avx(auVar34._0_32_,auVar15);
            auVar37 = vminps_avx(auVar37,auVar14);
            auVar37 = vcmpps_avx(auVar9,auVar37,2);
            auVar47 = ZEXT3264(auVar37);
            if (((uint)uVar21 & 7) == 6) {
              auVar14 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x1c0),auVar41,2);
              auVar8 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
              auVar8 = vandps_avx(auVar14,auVar8);
              auVar37 = vandps_avx(auVar8,auVar37);
              auVar47 = ZEXT1664(auVar37._16_16_);
              auVar39 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
            }
            else {
              auVar39 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
            }
            auVar51 = ZEXT3264(auVar14);
            auVar39 = vpsllw_avx(auVar39,0xf);
            auVar39 = vpacksswb_avx(auVar39,auVar39);
            unaff_R14 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 |
                                      (SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar39 >> 0x3f,0) << 7);
            local_24e0.valid = (int *)auVar9._0_8_;
            local_24e0.geometryUserPtr = (void *)auVar9._8_8_;
            local_24e0.primID = auVar9._16_4_;
            local_24e0._20_4_ = auVar9._20_4_;
            local_24e0.context = (RTCRayQueryContext *)auVar9._24_8_;
          }
          if ((uVar21 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar18 = 4;
            }
            else {
              uVar19 = uVar21 & 0xfffffffffffffff0;
              lVar32 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              iVar18 = 0;
              uVar21 = *(ulong *)(uVar19 + lVar32 * 8);
              uVar26 = unaff_R14 - 1 & unaff_R14;
              if (uVar26 != 0) {
                uVar5 = *(uint *)((long)&local_24e0.valid + lVar32 * 4);
                lVar32 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                uVar7 = *(ulong *)(uVar19 + lVar32 * 8);
                uVar6 = *(uint *)((long)&local_24e0.valid + lVar32 * 4);
                uVar26 = uVar26 - 1 & uVar26;
                if (uVar26 == 0) {
                  if (uVar5 < uVar6) {
                    *(ulong *)*local_24f0 = uVar7;
                    *(uint *)(*local_24f0 + 8) = uVar6;
                    local_24f0 = local_24f0 + 1;
                  }
                  else {
                    *(ulong *)*local_24f0 = uVar21;
                    *(uint *)(*local_24f0 + 8) = uVar5;
                    uVar21 = uVar7;
                    local_24f0 = local_24f0 + 1;
                  }
                }
                else {
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = uVar21;
                  auVar39 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar5));
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar7;
                  auVar35 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar6));
                  lVar32 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                    }
                  }
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = *(ulong *)(uVar19 + lVar32 * 8);
                  auVar40 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)((long)&local_24e0.valid +
                                                                     lVar32 * 4)));
                  uVar26 = uVar26 - 1 & uVar26;
                  if (uVar26 == 0) {
                    auVar52 = vpcmpgtd_avx(auVar35,auVar39);
                    auVar42 = vpshufd_avx(auVar52,0xaa);
                    auVar52 = vblendvps_avx(auVar35,auVar39,auVar42);
                    auVar39 = vblendvps_avx(auVar39,auVar35,auVar42);
                    auVar35 = vpcmpgtd_avx(auVar40,auVar52);
                    auVar42 = vpshufd_avx(auVar35,0xaa);
                    auVar35 = vblendvps_avx(auVar40,auVar52,auVar42);
                    auVar51 = ZEXT1664(auVar35);
                    auVar40 = vblendvps_avx(auVar52,auVar40,auVar42);
                    auVar52 = vpcmpgtd_avx(auVar40,auVar39);
                    auVar42 = vpshufd_avx(auVar52,0xaa);
                    auVar47 = ZEXT1664(auVar42);
                    auVar52 = vblendvps_avx(auVar40,auVar39,auVar42);
                    auVar55 = ZEXT1664(auVar52);
                    auVar39 = vblendvps_avx(auVar39,auVar40,auVar42);
                    auVar38 = ZEXT1664(auVar39);
                    *local_24f0 = auVar39;
                    local_24f0[1] = auVar52;
                    uVar21 = auVar35._0_8_;
                    local_24f0 = local_24f0 + 2;
                  }
                  else {
                    lVar32 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                      }
                    }
                    uVar5 = *(uint *)((long)&local_24e0.valid + lVar32 * 4);
                    auVar55 = ZEXT464(uVar5);
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = *(ulong *)(uVar19 + lVar32 * 8);
                    auVar52 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar5));
                    uVar26 = uVar26 - 1 & uVar26;
                    if (uVar26 == 0) {
                      auVar42 = vpcmpgtd_avx(auVar35,auVar39);
                      auVar43 = vpshufd_avx(auVar42,0xaa);
                      auVar42 = vblendvps_avx(auVar35,auVar39,auVar43);
                      auVar39 = vblendvps_avx(auVar39,auVar35,auVar43);
                      auVar35 = vpcmpgtd_avx(auVar52,auVar40);
                      auVar43 = vpshufd_avx(auVar35,0xaa);
                      auVar35 = vblendvps_avx(auVar52,auVar40,auVar43);
                      auVar40 = vblendvps_avx(auVar40,auVar52,auVar43);
                      auVar52 = vpcmpgtd_avx(auVar40,auVar39);
                      auVar43 = vpshufd_avx(auVar52,0xaa);
                      auVar52 = vblendvps_avx(auVar40,auVar39,auVar43);
                      auVar39 = vblendvps_avx(auVar39,auVar40,auVar43);
                      auVar40 = vpcmpgtd_avx(auVar35,auVar42);
                      auVar43 = vpshufd_avx(auVar40,0xaa);
                      auVar40 = vblendvps_avx(auVar35,auVar42,auVar43);
                      auVar35 = vblendvps_avx(auVar42,auVar35,auVar43);
                      auVar42 = vpcmpgtd_avx(auVar52,auVar35);
                      auVar43 = vpshufd_avx(auVar42,0xaa);
                      auVar55 = ZEXT1664(auVar43);
                      auVar42 = vblendvps_avx(auVar52,auVar35,auVar43);
                      auVar35 = vblendvps_avx(auVar35,auVar52,auVar43);
                      *local_24f0 = auVar39;
                      local_24f0[1] = auVar35;
                      local_24f0[2] = auVar42;
                      uVar21 = auVar40._0_8_;
                      pauVar33 = local_24f0 + 3;
                    }
                    else {
                      *local_24f0 = auVar39;
                      local_24f0[1] = auVar35;
                      local_24f0[2] = auVar40;
                      local_24f0[3] = auVar52;
                      lVar32 = 0x30;
                      do {
                        lVar24 = lVar32;
                        lVar32 = 0;
                        if (uVar26 != 0) {
                          for (; (uVar26 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                          }
                        }
                        auVar36._8_8_ = 0;
                        auVar36._0_8_ = *(ulong *)(uVar19 + lVar32 * 8);
                        auVar39 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)((long)&local_24e0.valid
                                                                           + lVar32 * 4)));
                        *(undefined1 (*) [16])(local_24f0[1] + lVar24) = auVar39;
                        uVar26 = uVar26 & uVar26 - 1;
                        lVar32 = lVar24 + 0x10;
                      } while (uVar26 != 0);
                      pauVar33 = (undefined1 (*) [16])(local_24f0[1] + lVar24);
                      if (lVar24 + 0x10 != 0) {
                        lVar32 = 0x10;
                        pauVar22 = local_24f0;
                        do {
                          auVar39 = pauVar22[1];
                          uVar5 = *(uint *)(pauVar22[1] + 8);
                          pauVar22 = pauVar22 + 1;
                          lVar24 = lVar32;
                          do {
                            if (uVar5 <= *(uint *)(local_24f0[-1] + lVar24 + 8)) {
                              pauVar25 = (undefined1 (*) [16])(*local_24f0 + lVar24);
                              break;
                            }
                            *(undefined1 (*) [16])(*local_24f0 + lVar24) =
                                 *(undefined1 (*) [16])(local_24f0[-1] + lVar24);
                            lVar24 = lVar24 + -0x10;
                            pauVar25 = local_24f0;
                          } while (lVar24 != 0);
                          *pauVar25 = auVar39;
                          lVar32 = lVar32 + 0x10;
                        } while (pauVar33 != pauVar22);
                      }
                      uVar21 = *(ulong *)*pauVar33;
                    }
                    auVar38 = ZEXT1664(auVar39);
                    auVar51 = ZEXT1664(auVar52);
                    auVar47 = ZEXT1664(auVar40);
                    auVar57 = ZEXT3264(auVar56);
                    auVar59 = ZEXT3264(auVar58);
                    auVar61 = ZEXT3264(auVar60);
                    auVar62 = ZEXT3264(auVar62._0_32_);
                    auVar63 = ZEXT3264(auVar63._0_32_);
                    auVar64 = ZEXT3264(auVar64._0_32_);
                    auVar65 = ZEXT3264(auVar65._0_32_);
                    local_24f0 = pauVar33;
                    iVar18 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar18 = 6;
          }
        } while (iVar18 == 0);
        if (iVar18 == 6) {
          uVar29 = (ulong)((uint)uVar21 & 0xf);
          if (uVar29 != 8) {
            local_24e8 = local_2510->scene;
            lVar32 = 0;
            do {
              local_24e0.geomID = *(uint *)((uVar21 & 0xfffffffffffffff0) + lVar32 * 8);
              local_24b0 = (local_24e8->geometries).items[local_24e0.geomID].ptr;
              if (((ray->super_RayK<1>).mask & local_24b0->mask) != 0) {
                local_2514 = 0xffffffff;
                local_24e0.geometryUserPtr = local_24b0->userPtr;
                local_24e0.valid = &local_2514;
                auVar39 = (undefined1  [16])local_24e0._0_16_;
                local_24e0.context = local_2510->user;
                local_24e0.N = 1;
                local_24e0.primID = *(undefined4 *)((uVar21 & 0xfffffffffffffff0) + 4 + lVar32 * 8);
                local_24e0._0_20_ = CONCAT416(local_24e0.primID,auVar39);
                local_24a8 = 0;
                local_24a0 = local_2510->args;
                pp_Var20 = (_func_int **)local_24a0->intersect;
                if (pp_Var20 == (_func_int **)0x0) {
                  pp_Var20 = local_24b0[1].super_RefCount._vptr_RefCount;
                }
                auVar47 = ZEXT1664(auVar47._0_16_);
                auVar51 = ZEXT1664(auVar51._0_16_);
                auVar55 = ZEXT1664(auVar55._0_16_);
                local_24e0.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var20)(&local_24e0);
                auVar57 = ZEXT3264(local_23c0);
                auVar59 = ZEXT3264(local_23e0);
                auVar61 = ZEXT3264(local_2400);
                auVar62 = ZEXT3264(local_2420);
                auVar63 = ZEXT3264(local_2440);
                auVar64 = ZEXT3264(local_2460);
                auVar65 = ZEXT3264(local_2480);
              }
              lVar32 = lVar32 + 1;
            } while (uVar29 - 8 != lVar32);
          }
          fVar10 = (ray->super_RayK<1>).tfar;
          auVar34 = ZEXT3264(CONCAT428(fVar10,CONCAT424(fVar10,CONCAT420(fVar10,CONCAT416(fVar10,
                                                  CONCAT412(fVar10,CONCAT48(fVar10,CONCAT44(fVar10,
                                                  fVar10))))))));
          uVar29 = local_24f8;
          uVar30 = local_2500;
          uVar31 = local_2508;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }